

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O2

void dump_hex_script(envy_bios *bios,FILE *out,uint start,uint length)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  
  iVar1 = 0;
  while (length != 0) {
    uVar3 = 0x10;
    if (length < 0x10) {
      uVar3 = (ulong)length;
    }
    if (iVar1 == 0) {
      fprintf((FILE *)out,"%04x:",(ulong)start);
    }
    else {
      fwrite("     ",5,1,(FILE *)out);
    }
    iVar4 = (int)uVar3;
    uVar5 = start;
    while( true ) {
      bVar6 = uVar3 == 0;
      uVar3 = uVar3 - 1;
      if (bVar6) break;
      fprintf((FILE *)out," %02x",(ulong)bios->data[uVar5]);
      uVar5 = uVar5 + 1;
    }
    length = length - iVar4;
    if (length == 0) {
      for (iVar2 = iVar4 + -0x10; iVar2 != 0; iVar2 = iVar2 + 1) {
        fwrite("   ",3,1,(FILE *)out);
      }
      fwrite("  ",2,1,(FILE *)out);
    }
    else {
      fputc(10,(FILE *)out);
    }
    start = start + iVar4;
    iVar1 = iVar1 + 1;
  }
  return;
}

Assistant:

void dump_hex_script (struct envy_bios *bios, FILE *out, unsigned int start, unsigned int length) {
	int cnt = 0;
	while (length) {
		unsigned int i, len = length;
		if (len > 16) len = 16;
		if (cnt)
			fprintf (out, "     ");
		else
			fprintf (out, "%04x:", start);
		for (i = 0; i < len; i++)
			fprintf(out, " %02x", bios->data[start+i]);
		start += len;
		length -= len;
		if (length) {
			fprintf(out, "\n");
		} else {
			while (len < 16) {
				fprintf(out, "   ");
				len++;
			}
			fprintf(out, "  ");
		}
		cnt++;
	}
}